

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rst_display_driver.cpp
# Opt level: O0

void __thiscall RstDisplayDriver::display(RstDisplayDriver *this,Document *doc,ostream *output)

{
  ulong uVar1;
  size_type sVar2;
  Paragraph *pPVar3;
  undefined4 uVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ostream *poVar8;
  void *pvVar9;
  BoldLineElement *local_3a8;
  UrlLineElement *local_398;
  size_t local_388;
  ItalicLineElement *local_378;
  string local_318 [39];
  allocator<char> local_2f1;
  string local_2f0 [39];
  allocator<char> local_2c9;
  string local_2c8 [39];
  allocator<char> local_2a1;
  string local_2a0 [32];
  string local_280 [32];
  string local_260 [32];
  string local_240 [32];
  string local_220 [32];
  ulong local_200;
  size_t j;
  ulong local_1e8;
  size_t i;
  stringstream url_data;
  ostream local_1d0 [376];
  size_type local_58;
  size_t text_len;
  UrlLineElement *url_le;
  BoldLineElement *bold_le;
  ItalicLineElement *italic_le;
  CodeLineElement *code_le;
  LineElement *l;
  Paragraph *p;
  ostream *output_local;
  Document *doc_local;
  RstDisplayDriver *this_local;
  
  l = (LineElement *)0x0;
  code_le = (CodeLineElement *)0x0;
  italic_le = (ItalicLineElement *)0x0;
  bold_le = (BoldLineElement *)0x0;
  url_le = (UrlLineElement *)0x0;
  text_len = 0;
  local_58 = 0;
  p = (Paragraph *)output;
  output_local = (ostream *)doc;
  doc_local = (Document *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&i);
  for (local_1e8 = 0; uVar1 = local_1e8, uVar6 = Document::size(), pPVar3 = p, uVar1 < uVar6;
      local_1e8 = local_1e8 + 1) {
    l = (LineElement *)Document::operator[]((ulong)output_local);
    uVar4 = (**(code **)(*(long *)l + 8))();
    switch(uVar4) {
    case 7:
      std::operator<<((ostream *)p,"#) ");
      break;
    case 8:
      std::operator<<((ostream *)p,"- ");
      break;
    default:
      break;
    case 10:
      std::operator<<((ostream *)p,"    ");
      break;
    case 0xb:
      poVar8 = std::operator<<((ostream *)p,"::");
      pvVar9 = (void *)std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
      std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
    }
    for (local_200 = 0; uVar1 = local_200, uVar6 = Paragraph::size(), uVar1 < uVar6;
        local_200 = local_200 + 1) {
      code_le = (CodeLineElement *)Paragraph::operator[]((ulong)l);
      if (code_le == (CodeLineElement *)0x0) {
        local_378 = (ItalicLineElement *)0x0;
      }
      else {
        local_378 = (ItalicLineElement *)
                    __dynamic_cast(code_le,&LineElement::typeinfo,&CodeLineElement::typeinfo,0);
      }
      italic_le = local_378;
      if (code_le == (CodeLineElement *)0x0) {
        local_388 = 0;
      }
      else {
        local_388 = __dynamic_cast(code_le,&LineElement::typeinfo,&UrlLineElement::typeinfo,0);
      }
      text_len = local_388;
      if (code_le == (CodeLineElement *)0x0) {
        local_398 = (UrlLineElement *)0x0;
      }
      else {
        local_398 = (UrlLineElement *)
                    __dynamic_cast(code_le,&LineElement::typeinfo,&BoldLineElement::typeinfo,0);
      }
      url_le = local_398;
      if (code_le == (CodeLineElement *)0x0) {
        local_3a8 = (BoldLineElement *)0x0;
      }
      else {
        local_3a8 = (BoldLineElement *)
                    __dynamic_cast(code_le,&LineElement::typeinfo,&ItalicLineElement::typeinfo,0);
      }
      bold_le = local_3a8;
      if ((italic_le == (ItalicLineElement *)0x0) ||
         (iVar5 = (**(code **)(*(long *)l + 8))(), iVar5 == 0xb)) {
        if (text_len == 0) {
          if (url_le == (UrlLineElement *)0x0) {
            if (bold_le != (BoldLineElement *)0x0) {
              std::operator<<((ostream *)p,"*");
            }
          }
          else {
            std::operator<<((ostream *)p,"**");
          }
        }
        else {
          std::operator<<((ostream *)p,"`");
        }
      }
      else {
        std::operator<<((ostream *)p,"``");
      }
      (**(code **)(*(long *)code_le + 0x10))(local_220);
      lVar7 = std::__cxx11::string::length();
      local_58 = local_58 + lVar7;
      std::__cxx11::string::~string(local_220);
      pPVar3 = p;
      (**(code **)(*(long *)code_le + 0x10))(local_240);
      std::operator<<((ostream *)pPVar3,local_240);
      std::__cxx11::string::~string(local_240);
      if ((italic_le == (ItalicLineElement *)0x0) ||
         (iVar5 = (**(code **)(*(long *)l + 8))(), iVar5 == 0xb)) {
        if (text_len == 0) {
          if (url_le == (UrlLineElement *)0x0) {
            if (bold_le != (BoldLineElement *)0x0) {
              std::operator<<((ostream *)p,"*");
            }
          }
          else {
            std::operator<<((ostream *)p,"**");
          }
        }
        else {
          std::operator<<((ostream *)p,"`_");
          poVar8 = std::operator<<(local_1d0,".. _");
          (**(code **)(*(long *)code_le + 0x10))(local_260);
          poVar8 = std::operator<<(poVar8,local_260);
          poVar8 = std::operator<<(poVar8," : ");
          UrlLineElement::url_abi_cxx11_();
          poVar8 = std::operator<<(poVar8,local_280);
          std::ostream::operator<<(poVar8,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string(local_280);
          std::__cxx11::string::~string(local_260);
        }
      }
      else {
        std::operator<<((ostream *)p,"``");
      }
    }
    iVar5 = (**(code **)(*(long *)l + 8))();
    if (iVar5 == 1) {
      poVar8 = (ostream *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      sVar2 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2a0,sVar2,'=',&local_2a1);
      std::operator<<(poVar8,local_2a0);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
    }
    else if (iVar5 == 2) {
      poVar8 = (ostream *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      sVar2 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2c8,sVar2,'-',&local_2c9);
      std::operator<<(poVar8,local_2c8);
      std::__cxx11::string::~string(local_2c8);
      std::allocator<char>::~allocator(&local_2c9);
    }
    else if (iVar5 == 3) {
      poVar8 = (ostream *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
      sVar2 = local_58;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_2f0,sVar2,'~',&local_2f1);
      std::operator<<(poVar8,local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::allocator<char>::~allocator(&local_2f1);
    }
    local_58 = 0;
    pvVar9 = (void *)std::ostream::operator<<(p,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar9,std::endl<char,std::char_traits<char>>);
  }
  std::__cxx11::stringstream::str();
  std::operator<<((ostream *)pPVar3,local_318);
  std::__cxx11::string::~string(local_318);
  std::__cxx11::stringstream::~stringstream((stringstream *)&i);
  return;
}

Assistant:

void RstDisplayDriver::display(Document * doc, ostream & output) {
	Paragraph *p(nullptr);
	LineElement *l(nullptr);
	CodeLineElement *code_le(nullptr);
	ItalicLineElement *italic_le(nullptr);
	BoldLineElement *bold_le(nullptr);
	UrlLineElement *url_le(nullptr);
	size_t text_len(0);
	stringstream url_data;

	for (size_t i(0); i < doc->size(); ++i) {
		p = (*doc)[i];

		switch (p->level()) {
			case Paragraph::Level::UList1:
				output << "- ";
				break;
			case Paragraph::Level::OList1:
				output << "#) ";
				break;
			case Paragraph::Level::Quote:
				output << "    ";
				break;
			case Paragraph::Level::Code:
				output << "::" << endl << endl;
				break;
			default:
				break;

		}
		for (size_t j(0); j < p->size(); ++j) {
			l = (*p)[j];
			
			code_le = dynamic_cast<CodeLineElement*>(l);
			url_le = dynamic_cast<UrlLineElement*>(l);
			bold_le = dynamic_cast<BoldLineElement*>(l);
			italic_le = dynamic_cast<ItalicLineElement*>(l);
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`";
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}

			text_len += l->content().length();
			output << l->content();
			
			if (code_le and p->level() != Paragraph::Level::Code) {
				output << "``";
			} else if (url_le) {
				output << "`_";
				url_data << ".. _" << l->content() << " : " << url_le->url() << endl;
			} else if (bold_le) {
				output << "**";
			} else if (italic_le) {
				output << "*";
			}
		}

		switch (p->level()) {
			case Paragraph::Level::Title1:
				output << endl << std::string(text_len, '=');
				break;
			case Paragraph::Level::Title2:
				output << endl << std::string(text_len, '-');
				break;
			case Paragraph::Level::Title3:
				output << endl << std::string(text_len, '~');
				break;
			default:
				break;

		}

		text_len = 0;
		output << endl << endl;
	}

	output << url_data.str();
}